

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

CompileInfo * __thiscall cmGeneratorTarget::GetCompileInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_bool>
  pVar4;
  allocator<char> local_a1;
  string msg;
  string config_upper;
  CompileInfo info;
  
  bVar1 = IsImported(this);
  if (!bVar1) {
    TVar2 = GetType(this);
    if ((int)TVar2 < 5) {
      config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
      config_upper._M_string_length = 0;
      config_upper.field_2._M_local_buf[0] = '\0';
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase(&msg,config);
        std::__cxx11::string::operator=((string *)&config_upper,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
              ::find(&(this->CompileInfoMap)._M_t,&config_upper);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        info.CompilePdbDir._M_dataplus._M_p = (pointer)&info.CompilePdbDir.field_2;
        info.CompilePdbDir._M_string_length = 0;
        info.CompilePdbDir.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>((string *)&msg,"COMPILE_PDB",&local_a1);
        ComputePDBOutputDir(this,&msg,config,&info.CompilePdbDir);
        std::__cxx11::string::~string((string *)&msg);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::CompileInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                    *)&msg,&config_upper,&info);
        pVar4 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                ::
                _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                            *)&this->CompileInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                            *)&msg);
        iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                 *)&msg);
        std::__cxx11::string::~string((string *)&info);
      }
      std::__cxx11::string::~string((string *)&config_upper);
      return (CompileInfo *)(iVar3._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"cmTarget::GetCompileInfo called for ",
               (allocator<char> *)&config_upper);
    GetName_abi_cxx11_(this);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
    TVar2 = GetType(this);
    cmState::GetTargetTypeName(TVar2);
    std::__cxx11::string::append((char *)&msg);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (CompileInfo *)0x0;
}

Assistant:

cmGeneratorTarget::CompileInfo const* cmGeneratorTarget::GetCompileInfo(
  const std::string& config) const
{
  // There is no compile information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  if (this->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    std::string msg = "cmTarget::GetCompileInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmState::GetTargetTypeName(this->GetType());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  CompileInfoMapType::const_iterator i =
    this->CompileInfoMap.find(config_upper);
  if (i == this->CompileInfoMap.end()) {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->CompileInfoMap.insert(entry).first;
  }
  return &i->second;
}